

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool bitset_array_container_iandnot
                (bitset_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  uint64_t uVar1;
  array_container_t *paVar2;
  int iVar3;
  
  *dst = src_1;
  uVar1 = bitset_clear_list(src_1->words,(long)src_1->cardinality,src_2->array,
                            (long)src_2->cardinality);
  iVar3 = (int)uVar1;
  src_1->cardinality = iVar3;
  if (iVar3 < 0x1001) {
    paVar2 = array_container_from_bitset(src_1);
    *dst = paVar2;
    (*global_memory_hook.aligned_free)(src_1->words);
    (*global_memory_hook.free)(src_1);
  }
  return 0x1000 < iVar3;
}

Assistant:

bool bitset_array_container_iandnot(bitset_container_t *src_1,
                                    const array_container_t *src_2,
                                    container_t **dst) {
    *dst = src_1;
    src_1->cardinality =
        (int32_t)bitset_clear_list(src_1->words, (uint64_t)src_1->cardinality,
                                   src_2->array, (uint64_t)src_2->cardinality);

    if (src_1->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(src_1);
        bitset_container_free(src_1);
        return false;  // not bitset
    } else
        return true;
}